

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastBmS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  byte bVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint uVar9;
  char *pcVar10;
  uint *puVar11;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b8;
  Arena *local_1b0;
  Arena *arena;
  MicroString *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_198;
  uchar saved_tag;
  uint64_t local_190;
  TcParseTableBase *local_188;
  ParseContext *local_180;
  char *local_178;
  MessageLite *local_170;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_168;
  TcFieldData local_160;
  TcFieldData local_158;
  undefined1 local_149;
  ulong uStack_148;
  bool always_return;
  TcParseTableBase *local_140;
  ParseContext *local_138;
  char *local_130;
  MessageLite *local_128;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_120;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_118;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_110;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_190 = hasbits;
  local_188 = table;
  local_180 = ctx;
  local_178 = ptr;
  local_170 = msg;
  local_168 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_168);
  pMVar2 = local_170;
  pcVar10 = local_178;
  pPVar1 = local_180;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe68);
    pcVar10 = MiniParse(pMVar2,pcVar10,pPVar1,(TcFieldData)aStack_198,local_188,local_190);
    return pcVar10;
  }
  field._7_1_ = UnalignedLoad<unsigned_char>(local_178);
  local_178 = local_178 + 1;
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)&local_168);
  pMVar2 = local_170;
  local_190 = 1L << (bVar5 & 0x3f) | local_190;
  uVar7 = TcFieldData::offset((TcFieldData *)&local_168);
  arena = (Arena *)RefAt<google::protobuf::internal::MicroString>(pMVar2,(ulong)uVar7);
  local_1b0 = MessageLite::GetArena(local_170);
  pcVar10 = local_178;
  pPVar1 = local_180;
  if (local_1b0 == (Arena *)0x0) {
    TcFieldData::aux_idx((TcFieldData *)&local_168);
    local_178 = EpsCopyInputStream::ReadMicroString
                          (&pPVar1->super_EpsCopyInputStream,pcVar10,(MicroString *)arena,
                           (Arena *)0x0);
  }
  else {
    TcFieldData::aux_idx((TcFieldData *)&local_168);
    local_178 = EpsCopyInputStream::ReadMicroString
                          (&pPVar1->super_EpsCopyInputStream,pcVar10,(MicroString *)arena,local_1b0)
    ;
  }
  pMVar2 = local_170;
  pcVar10 = local_178;
  pPVar1 = local_180;
  if (local_178 == (char *)0x0) {
    anon_unknown_104::EnsureArenaStringIsNotDefault(local_170,arena);
    pMVar2 = local_170;
    pcVar10 = local_178;
    pPVar1 = local_180;
    TcFieldData::TcFieldData((TcFieldData *)&local_1b8);
    pcVar10 = Error(pMVar2,pcVar10,pPVar1,(TcFieldData)local_1b8,local_188,local_190);
    return pcVar10;
  }
  TcFieldData::TcFieldData(&data_local);
  local_120 = data_local.field_0;
  local_128 = pMVar2;
  local_130 = pcVar10;
  local_138 = pPVar1;
  local_140 = local_188;
  uStack_148 = local_190;
  local_149 = 0;
  bVar6 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar10);
  pMVar2 = local_128;
  pcVar10 = local_130;
  pPVar1 = local_138;
  if (!bVar6) {
    TcFieldData::TcFieldData(&local_158);
    if (local_140->has_bits_offset != 0) {
      uVar9 = (uint)uStack_148;
      puVar11 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_140->has_bits_offset);
      *puVar11 = uVar9 | *puVar11;
    }
    return pcVar10;
  }
  TcFieldData::TcFieldData(&local_160);
  this = local_140;
  uVar3 = uStack_148;
  uVar8 = UnalignedLoad<unsigned_short>(pcVar10);
  uVar12 = (ulong)(int)((uint)uVar8 & (uint)this->fast_idx_mask);
  if ((uVar12 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar12 >> 3);
  local_110.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar8;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_118.data = local_110.data;
  pcVar10 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar10,pPVar1,(TcFieldData)local_110,this,uVar3);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBmS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, MicroString, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}